

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

RegexPattern *
Js::RegexHelper::CompileDynamic
          (ScriptContext *scriptContext,char16 *psz,CharCount csz,char16 *pszOpts,CharCount cszOpts,
          bool isLiteralSource)

{
  code *pcVar1;
  bool bVar2;
  charcount_t length;
  undefined4 *puVar3;
  RegexPatternMruMap *this;
  char16 *source_00;
  undefined1 local_78 [8];
  RegexKey finalKey;
  InternalString source;
  RegexPatternMruMap *dynamicRegexMap;
  RegexPattern *pattern;
  RegexKey lookupKey;
  RegexFlags flags;
  bool isLiteralSource_local;
  CharCount cszOpts_local;
  char16 *pszOpts_local;
  CharCount csz_local;
  char16 *psz_local;
  ScriptContext *scriptContext_local;
  
  lookupKey.length._3_1_ = isLiteralSource;
  lookupKey._12_4_ = cszOpts;
  if ((psz == (char16 *)0x0) || (psz[csz] != L'\0')) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x51,"(psz != 0 && psz[csz] == 0)","psz != 0 && psz[csz] == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((pszOpts == (char16 *)0x0) && (lookupKey._12_4_ != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x52,"(pszOpts != 0 || cszOpts == 0)",
                                "pszOpts != 0 || cszOpts == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((pszOpts != (char16 *)0x0) && (pszOpts[(uint)lookupKey._12_4_] != L'\0')) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x53,"(pszOpts == 0 || pszOpts[cszOpts] == 0)",
                                "pszOpts == 0 || pszOpts[cszOpts] == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  lookupKey.length._2_1_ = NoRegexFlags;
  if ((pszOpts != (char16 *)0x0) &&
     (bVar2 = GetFlags(scriptContext,pszOpts,lookupKey._12_4_,
                       (RegexFlags *)((long)&lookupKey.length + 2)), !bVar2)) {
    PrimCompileDynamic(scriptContext,psz,csz,pszOpts,lookupKey._12_4_,
                       (bool)(lookupKey.length._3_1_ & 1));
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x5d,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((lookupKey.length._3_1_ & 1) == 0) {
    UnifiedRegex::RegexKey::RegexKey((RegexKey *)&pattern,psz,csz,lookupKey.length._2_1_);
    dynamicRegexMap = (RegexPatternMruMap *)0x0;
    this = ScriptContext::GetDynamicRegexMap(scriptContext);
    bVar2 = JsUtil::
            MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
            ::TryGetValue(this,(RegexKey *)&pattern,(RegexPattern **)&dynamicRegexMap);
    if (!bVar2) {
      dynamicRegexMap =
           (RegexPatternMruMap *)
           PrimCompileDynamic(scriptContext,psz,csz,pszOpts,lookupKey._12_4_,
                              (bool)(lookupKey.length._3_1_ & 1));
      UnifiedRegex::RegexPattern::GetSource((RegexPattern *)&finalKey.length);
      source_00 = InternalString::GetBuffer((InternalString *)&finalKey.length);
      length = InternalString::GetLength((InternalString *)&finalKey.length);
      UnifiedRegex::RegexKey::RegexKey((RegexKey *)local_78,source_00,length,lookupKey.length._2_1_)
      ;
      JsUtil::
      MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
      ::Add(this,(RegexKey *)local_78,(RegexPattern **)&dynamicRegexMap);
    }
    scriptContext_local = (ScriptContext *)dynamicRegexMap;
  }
  else {
    scriptContext_local =
         (ScriptContext *)
         PrimCompileDynamic(scriptContext,psz,csz,pszOpts,lookupKey._12_4_,
                            (bool)(lookupKey.length._3_1_ & 1));
  }
  return (RegexPattern *)scriptContext_local;
}

Assistant:

UnifiedRegex::RegexPattern* RegexHelper::CompileDynamic(ScriptContext *scriptContext, const char16* psz, CharCount csz, const char16* pszOpts, CharCount cszOpts, bool isLiteralSource)
    {
        Assert(psz != 0 && psz[csz] == 0);
        Assert(pszOpts != 0 || cszOpts == 0);
        Assert(pszOpts == 0 || pszOpts[cszOpts] == 0);

        UnifiedRegex::RegexFlags flags = UnifiedRegex::NoRegexFlags;

        if (pszOpts != NULL)
        {
            if (!GetFlags(scriptContext, pszOpts, cszOpts, flags))
            {
                // Compile in order to throw appropriate error for ill-formed flags
                PrimCompileDynamic(scriptContext, psz, csz, pszOpts, cszOpts, isLiteralSource);
                Assert(false);
            }
        }

        if(isLiteralSource)
        {
            // The source is from a literal regex, so we're cloning a literal regex. Don't use the dynamic regex MRU map since
            // these literal regex patterns' lifetimes are tied with the function body.
            return PrimCompileDynamic(scriptContext, psz, csz, pszOpts, cszOpts, isLiteralSource);
        }

        UnifiedRegex::RegexKey lookupKey(psz, csz, flags);
        UnifiedRegex::RegexPattern* pattern = nullptr;
        RegexPatternMruMap* dynamicRegexMap = scriptContext->GetDynamicRegexMap();
        if (!dynamicRegexMap->TryGetValue(lookupKey, &pattern))
        {
            pattern = PrimCompileDynamic(scriptContext, psz, csz, pszOpts, cszOpts, isLiteralSource);

            // WARNING: Must calculate key again so that dictionary has copy of source associated with the pattern
            const auto source = pattern->GetSource();
            UnifiedRegex::RegexKey finalKey(source.GetBuffer(), source.GetLength(), flags);
            dynamicRegexMap->Add(finalKey, pattern);
        }
        return pattern;
    }